

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O1

string * efsw::Errors::Log::getLastErrorLog_abi_cxx11_(void)

{
  string *in_RDI;
  
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)in_RDI,LastError_abi_cxx11_,DAT_0011f380 + LastError_abi_cxx11_);
  return in_RDI;
}

Assistant:

std::string Log::getLastErrorLog() {
	return LastError;
}